

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Connection *c)

{
  Constant *in_RAX;
  Expression *pEVar1;
  Constant *pCVar2;
  Constant *pCVar3;
  pool_ptr<soul::AST::Constant> cv;
  pool_ptr<soul::AST::Constant> local_18;
  
  local_18.object = in_RAX;
  ASTVisitor::visit(&this->super_ASTVisitor,c);
  if ((c->delayLength).object != (Expression *)0x0) {
    pEVar1 = pool_ptr<soul::AST::Expression>::operator*(&c->delayLength);
    throwErrorIfNotReadableValue(pEVar1);
    pEVar1 = pool_ptr<soul::AST::Expression>::operator->(&c->delayLength);
    (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_18,pEVar1);
    if (local_18.object != (Constant *)0x0) {
      pCVar2 = pool_ptr<soul::AST::Constant>::operator->(&local_18);
      pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&local_18);
      checkDelayLineLength
                (&(pCVar2->super_Expression).super_Statement.super_ASTObject.context,&pCVar3->value)
      ;
    }
  }
  return;
}

Assistant:

void visit (AST::Connection& c) override
        {
            super::visit (c);

            if (c.delayLength != nullptr)
            {
                throwErrorIfNotReadableValue (*c.delayLength);

                if (auto cv = c.delayLength->getAsConstant())
                    checkDelayLineLength (cv->context, cv->value);
            }
        }